

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * findvararg(CallInfo *ci,int n,StkId *pos)

{
  uint uVar1;
  int nparams;
  StkId *pos_local;
  int n_local;
  CallInfo *ci_local;
  
  uVar1 = (uint)*(byte *)(*(long *)((ci->func->value_).f + 0x18) + 10);
  if (n < (int)((int)((long)(ci->u).l.base - (long)ci->func >> 4) - uVar1)) {
    *pos = ci->func + (long)(int)uVar1 + (long)n;
    ci_local = (CallInfo *)anon_var_dwarf_521b;
  }
  else {
    ci_local = (CallInfo *)0x0;
  }
  return (char *)ci_local;
}

Assistant:

static const char *findvararg(CallInfo *ci, int n, StkId *pos) {
    int nparams = clLvalue(ci->func)->p->numparams;
    if (n >= cast_int(ci->u.l.base - ci->func) - nparams)
        return NULL;  /* no such vararg */
    else {
        *pos = ci->func + nparams + n;
        return "(*vararg)";  /* generic name for any vararg */
    }
}